

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O2

void __thiscall
icu_63::UVector::sortedInsert(UVector *this,UElement e,UElementComparator *compare,UErrorCode *ec)

{
  UElement *pUVar1;
  int iVar2;
  int8_t iVar3;
  UBool UVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  iVar7 = this->count;
  iVar2 = 0;
  while (iVar8 = iVar2, iVar8 != iVar7) {
    iVar5 = (iVar8 + iVar7) / 2;
    iVar3 = (*compare)((UElement)this->elements[iVar5].pointer,(UElement)e.pointer);
    iVar2 = iVar5 + 1;
    if ('\0' < iVar3) {
      iVar7 = iVar5;
      iVar2 = iVar8;
    }
  }
  UVar4 = ensureCapacity(this,this->count + 1,ec);
  if (UVar4 != '\0') {
    for (lVar6 = (long)this->count; pUVar1 = this->elements, iVar7 < lVar6; lVar6 = lVar6 + -1) {
      pUVar1[lVar6] = pUVar1[lVar6 + -1];
    }
    pUVar1[iVar7] = e;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector::sortedInsert(UElement e, UElementComparator *compare, UErrorCode& ec) {
    // Perform a binary search for the location to insert tok at.  Tok
    // will be inserted between two elements a and b such that a <=
    // tok && tok < b, where there is a 'virtual' elements[-1] always
    // less than tok and a 'virtual' elements[count] always greater
    // than tok.
    int32_t min = 0, max = count;
    while (min != max) {
        int32_t probe = (min + max) / 2;
        int8_t c = (*compare)(elements[probe], e);
        if (c > 0) {
            max = probe;
        } else {
            // assert(c <= 0);
            min = probe + 1;
        }
    }
    if (ensureCapacity(count + 1, ec)) {
        for (int32_t i=count; i>min; --i) {
            elements[i] = elements[i-1];
        }
        elements[min] = e;
        ++count;
    }
}